

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

void __thiscall neueda::cdr::setDateTime(cdr *this,cdrKey_t *key,time_t value)

{
  cdrItem *in_RDI;
  cdrItem item;
  tm tm;
  cdrItem *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  cdrItemType in_stack_ffffffffffffff2c;
  cdrItem *in_stack_ffffffffffffff30;
  tm local_50;
  time_t local_18 [3];
  
  gmtime_r(local_18,&local_50);
  cdrItem::cdrItem(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  setItem((cdr *)in_stack_ffffffffffffff30,
          (cdrKey_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
          in_stack_ffffffffffffff20);
  cdrItem::~cdrItem(in_RDI);
  return;
}

Assistant:

void
cdr::setDateTime (const cdrKey_t& key, time_t value)
{
    tm tm;
    gmtime_r (&value, &tm);
    cdrItem item (CDR_DATETIME);
    item.mDateTime.mHour = tm.tm_hour;
    item.mDateTime.mMinute = tm.tm_min;
    item.mDateTime.mSecond = tm.tm_sec;
    item.mDateTime.mDay = tm.tm_mday;
    item.mDateTime.mMonth = tm.tm_mon + 1;
    item.mDateTime.mYear = tm.tm_year + 1900;
    setItem (key, item);
}